

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

UChar32 ucase_totitle_63(UChar32 c)

{
  ushort uVar1;
  ushort uVar2;
  sbyte sVar3;
  undefined2 *puVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint local_28;
  int32_t idx;
  int32_t delta;
  uint16_t excWord;
  uint16_t *pe;
  uint local_10;
  uint16_t props;
  UChar32 c_local;
  
  uVar5 = c >> 5;
  if ((uint)c < 0xd800) {
    local_3c = (uint)ucase_props_trieIndex[(int)uVar5] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar6 = 0;
      if (c < 0xdc00) {
        iVar6 = 0x140;
      }
      local_40 = (uint)ucase_props_trieIndex[(int)(iVar6 + uVar5)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0xe0800) {
          local_48 = (uint)ucase_props_trieIndex
                           [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar5 & 0x3f))]
                     * 4 + (c & 0x1fU);
        }
        else {
          local_48 = 0x2f1c;
        }
        local_44 = local_48;
      }
      else {
        local_44 = 0xd30;
      }
      local_40 = local_44;
    }
    local_3c = local_40;
  }
  uVar1 = ucase_props_trieIndex[local_3c];
  if ((uVar1 & 8) == 0) {
    local_10 = c;
    if ((uVar1 & 3) == 1) {
      local_10 = ((int)(short)uVar1 >> 7) + c;
    }
  }
  else {
    lVar7 = (long)((int)(uint)uVar1 >> 4) * 2 + 0x27ae12;
    uVar2 = ucase_props_exceptions[(int)(uint)uVar1 >> 4];
    if (((uVar2 & 0x10) != 0) && ((uVar1 & 3) == 1)) {
      if ((uVar2 & 0x100) == 0) {
        local_28 = (uint)*(ushort *)(lVar7 + (long)(int)(uint)""[(int)(uVar2 & 0xf)] * 2);
      }
      else {
        puVar4 = (undefined2 *)(lVar7 + (long)(int)((uint)""[(int)(uVar2 & 0xf)] << 1) * 2);
        local_28 = CONCAT22(*puVar4,puVar4[1]);
      }
      if ((uVar2 & 0x400) != 0) {
        local_28 = -local_28;
      }
      local_4c = c + local_28;
      return local_4c;
    }
    if ((uVar2 & 8) == 0) {
      if ((uVar2 & 4) == 0) {
        return c;
      }
      sVar3 = 2;
    }
    else {
      sVar3 = 3;
    }
    if ((uVar2 & 0x100) == 0) {
      local_10 = (uint)*(ushort *)
                        (lVar7 + (long)(int)(uint)""[(int)((uint)uVar2 & (1 << sVar3) - 1U)] * 2);
    }
    else {
      puVar4 = (undefined2 *)
               (lVar7 + (long)(int)((uint)""[(int)((uint)uVar2 & (1 << sVar3) - 1U)] << 1) * 2);
      local_10 = CONCAT22(*puVar4,puVar4[1]);
    }
  }
  return local_10;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
ucase_totitle(UChar32 c) {
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_GET_TYPE(props)==UCASE_LOWER) {
            c+=UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        uint16_t excWord=*pe++;
        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_GET_TYPE(props)==UCASE_LOWER) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        int32_t idx;
        if(HAS_SLOT(excWord, UCASE_EXC_TITLE)) {
            idx=UCASE_EXC_TITLE;
        } else if(HAS_SLOT(excWord, UCASE_EXC_UPPER)) {
            idx=UCASE_EXC_UPPER;
        } else {
            return c;
        }
        GET_SLOT_VALUE(excWord, idx, pe, c);
    }
    return c;
}